

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O3

void sf::priv::JoystickImpl::initialize(void)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  char *pcVar5;
  
  (anonymous_namespace)::udevContext = udev_new();
  if ((anonymous_namespace)::udevContext == 0) {
    poVar2 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Failed to create udev context, joystick support not available",0x3d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  (anonymous_namespace)::udevMonitor =
       udev_monitor_new_from_netlink((anonymous_namespace)::udevContext,"udev");
  if ((anonymous_namespace)::udevMonitor == 0) {
    poVar2 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "Failed to create udev monitor, joystick connections and disconnections won\'t be notified"
               ,0x58);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    iVar1 = udev_monitor_filter_add_match_subsystem_devtype
                      ((anonymous_namespace)::udevMonitor,"input",0);
    if (iVar1 < 0) {
      poVar2 = err();
      pcVar5 = 
      "Failed to add udev monitor filter, joystick connections and disconnections won\'t be notified: "
      ;
      lVar4 = 0x5e;
    }
    else {
      iVar1 = udev_monitor_enable_receiving();
      if (-1 < iVar1) goto LAB_00147380;
      poVar2 = err();
      pcVar5 = 
      "Failed to enable udev monitor, joystick connections and disconnections won\'t be notified: ";
      lVar4 = 0x5a;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar4);
    plVar3 = (long *)std::ostream::operator<<(poVar2,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    udev_monitor_unref();
    (anonymous_namespace)::udevMonitor = 0;
  }
LAB_00147380:
  anon_unknown.dwarf_134de4::updatePluggedList((udev_device *)0x0);
  return;
}

Assistant:

void JoystickImpl::initialize()
{
    udevContext = udev_new();

    if (!udevContext)
    {
        sf::err() << "Failed to create udev context, joystick support not available" << std::endl;
        return;
    }

    udevMonitor = udev_monitor_new_from_netlink(udevContext, "udev");

    if (!udevMonitor)
    {
        err() << "Failed to create udev monitor, joystick connections and disconnections won't be notified" << std::endl;
    }
    else
    {
        int error = udev_monitor_filter_add_match_subsystem_devtype(udevMonitor, "input", NULL);

        if (error < 0)
        {
            err() << "Failed to add udev monitor filter, joystick connections and disconnections won't be notified: " << error << std::endl;

            udev_monitor_unref(udevMonitor);
            udevMonitor = 0;
        }
        else
        {
            error = udev_monitor_enable_receiving(udevMonitor);

            if (error < 0)
            {
                err() << "Failed to enable udev monitor, joystick connections and disconnections won't be notified: " << error << std::endl;

                udev_monitor_unref(udevMonitor);
                udevMonitor = 0;
            }
        }
    }

    // Do an initial scan
    updatePluggedList();
}